

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::Federate::getCommand_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Federate *this)

{
  element_type *peVar1;
  bool bVar2;
  
  if ((this->hasPotentialInterfaces == true) &&
     (bVar2 = PotentialInterfacesManager::hasExtraCommands
                        ((this->potManager)._M_t.
                         super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                         .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>.
                         _M_head_impl), bVar2)) {
    PotentialInterfacesManager::getCommand_abi_cxx11_
              (__return_storage_ptr__,
               (this->potManager)._M_t.
               super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
               .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl);
    return __return_storage_ptr__;
  }
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Core[0x5c])(__return_storage_ptr__,peVar1,(ulong)(uint)(this->fedID).fid);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> Federate::getCommand()
{
    if (hasPotentialInterfaces) {
        if (potManager->hasExtraCommands()) {
            return potManager->getCommand();
        }
    }
    return coreObject->getCommand(fedID);
}